

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.h
# Opt level: O3

void __thiscall markdown::token::Image::~Image(Image *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Image_00166700;
  pcVar1 = (this->mTitle)._M_dataplus._M_p;
  paVar2 = &(this->mTitle).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->mUrl)._M_dataplus._M_p;
  paVar2 = &(this->mUrl).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->mAltText)._M_dataplus._M_p;
  paVar2 = &(this->mAltText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Image(const std::string& altText, const std::string& url, const std::string&
		title): mAltText(altText), mUrl(url), mTitle(title) { }